

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void player_update_light(player *p)

{
  ushort uVar1;
  uint32_t *puVar2;
  ushort uVar3;
  _Bool _Var4;
  _Bool _Var5;
  object *obj;
  _Bool dummy;
  object *burnt;
  
  obj = equipped_item_by_slot_name(p,"light");
  if (obj != (object *)0x0) {
    _Var4 = tval_is_light(obj);
    if (_Var4) {
      if (p->depth == 0) {
        _Var4 = is_daytime();
      }
      else {
        _Var4 = false;
      }
      _Var5 = flag_has_dbg(obj->flags,5,0x15,"obj->flags","OF_NO_FUEL");
      if ((!_Var5 && _Var4 == false) && (uVar3 = obj->timeout, 0 < (short)uVar3)) {
        uVar1 = uVar3 - 1;
        obj->timeout = uVar1;
        if ((uVar3 < 0x65) || (uVar1 % 100 == 0)) {
          puVar2 = &p->upkeep->redraw;
          *puVar2 = *puVar2 | 0x40000;
        }
        if (p->timed[2] == 0) {
          if (uVar1 == 0) {
            disturb(p);
            msg("Your light has gone out!");
            _Var4 = flag_has_dbg(obj->flags,5,0x13,"obj->flags","OF_BURNS_OUT");
            if (_Var4) {
              burnt = gear_object_for_use(p,obj,L'\x01',false,&dummy);
              if (burnt->known != (object *)0x0) {
                object_delete((chunk *)p->cave,(chunk *)0x0,&burnt->known);
              }
              object_delete((chunk *)cave,(chunk *)p->cave,&burnt);
            }
          }
          else if ((uVar3 < 0x33) && (uVar1 % 0x14 == 0)) {
            disturb(p);
            msg("Your light is growing faint.");
          }
        }
        else if (uVar1 == 0) {
          obj->timeout = 1;
        }
      }
    }
  }
  puVar2 = &p->upkeep->update;
  *puVar2 = *puVar2 | 2;
  return;
}

Assistant:

void player_update_light(struct player *p)
{
	/* Check for light being wielded */
	struct object *obj = equipped_item_by_slot_name(p, "light");

	/* Burn some fuel in the current light */
	if (obj && tval_is_light(obj)) {
		bool burn_fuel = true;

		/* Turn off the wanton burning of light during the day in the town */
		if (!p->depth && is_daytime())
			burn_fuel = false;

		/* If the light has the NO_FUEL flag, well... */
		if (of_has(obj->flags, OF_NO_FUEL))
		    burn_fuel = false;

		/* Use some fuel (except on artifacts, or during the day) */
		if (burn_fuel && obj->timeout > 0) {
			/* Decrease life-span */
			obj->timeout--;

			/* Hack -- notice interesting fuel steps */
			if ((obj->timeout < 100) || (!(obj->timeout % 100)))
				/* Redraw stuff */
				p->upkeep->redraw |= (PR_EQUIP);

			/* Hack -- Special treatment when blind */
			if (p->timed[TMD_BLIND]) {
				/* Hack -- save some light for later */
				if (obj->timeout == 0) obj->timeout++;
			} else if (obj->timeout == 0) {
				/* The light is now out */
				disturb(p);
				msg("Your light has gone out!");

				/* If it's a torch, now is the time to delete it */
				if (of_has(obj->flags, OF_BURNS_OUT)) {
					bool dummy;
					struct object *burnt =
						gear_object_for_use(p, obj, 1,
						false, &dummy);
					if (burnt->known)
						object_delete(p->cave, NULL, &burnt->known);
					object_delete(cave, p->cave, &burnt);
				}
			} else if ((obj->timeout < 50) && (!(obj->timeout % 20))) {
				/* The light is getting dim */
				disturb(p);
				msg("Your light is growing faint.");
			}
		}
	}

	/* Calculate torch radius */
	p->upkeep->update |= (PU_TORCH);
}